

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::GenerateSource
          (FileGenerator *this,Printer *printer)

{
  pointer *this_00;
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  Syntax SVar6;
  FileDescriptor *pFVar7;
  string *psVar8;
  size_type sVar9;
  reference args_1;
  reference puVar10;
  pointer pEVar11;
  reference ppFVar12;
  mapped_type *pmVar13;
  reference this_01;
  pointer this_02;
  reference puVar14;
  pointer pMVar15;
  FileDescriptor *file;
  FileDescriptor *file_00;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator_6;
  iterator __end3_5;
  iterator __begin3_5;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  *__range3_5;
  unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
  *generator_5;
  iterator __end3_4;
  iterator __begin3_4;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
  *__range3_4;
  key_type local_490;
  allocator local_469;
  key_type local_468;
  allocator local_441;
  key_type local_440;
  allocator local_419;
  key_type local_418;
  allocator local_3f1;
  key_type local_3f0;
  string local_3d0;
  allocator local_3a9;
  key_type local_3a8;
  allocator local_381;
  key_type local_380;
  undefined1 local_360 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string root_class_name;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  local_308;
  iterator iter_1;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator_4;
  iterator __end5_1;
  iterator __begin5_1;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  *__range5_1;
  unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
  *generator_3;
  iterator __end5;
  iterator __begin5;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
  *__range5;
  bool file_contains_extensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_2;
  iterator __end3_3;
  iterator __begin3_3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_3;
  unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
  *generator_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
  *__range3_2;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  *__range3_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fwd_decls;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  *__range3;
  iterator iStack_200;
  bool includes_oneof;
  __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  local_1f8;
  iterator iter;
  bool public_import;
  FileDescriptor *dep;
  int i_1;
  int local_1c4;
  undefined1 local_1c0 [4];
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  public_import_names;
  undefined1 local_188 [8];
  string header_extension;
  ImportWriter import_writer;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  deps_with_extensions;
  allocator local_51;
  value_type local_50;
  undefined1 local_30 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  Printer *printer_local;
  FileGenerator *this_local;
  
  headers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"GPBProtocolBuffers_RuntimeSupport.h",&local_51);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  PrintFileRuntimePreamble
            (this,(Printer *)
                  headers.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  bVar2 = anon_unknown_0::FileContainsEnums(this->file_);
  if (bVar2) {
    io::Printer::Print<>
              ((Printer *)
               headers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,"#import <stdatomic.h>\n\n");
  }
  this_00 = &import_writer.other_imports_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)this_00);
  anon_unknown_0::CollectMinimalFileDepsContainingExtensions
            (this->file_,
             (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              *)this_00);
  ImportWriter::ImportWriter
            ((ImportWriter *)((long)&header_extension.field_2 + 8),
             &(this->options_).generate_for_named_framework,
             &(this->options_).named_framework_to_proto_path_mappings_path,
             &(this->options_).runtime_import_prefix,(bool)(this->is_bundled_proto_ & 1));
  puVar1 = (anonymous_namespace)::kHeaderExtension;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_188,puVar1,
             (allocator *)
             ((long)&public_import_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&public_import_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  ImportWriter::AddFile
            ((ImportWriter *)((long)&header_extension.field_2 + 8),this->file_,(string *)local_188);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_1c0);
  for (local_1c4 = 0; iVar5 = FileDescriptor::public_dependency_count(this->file_),
      local_1c4 < iVar5; local_1c4 = local_1c4 + 1) {
    pFVar7 = FileDescriptor::public_dependency(this->file_,local_1c4);
    psVar8 = FileDescriptor::name_abi_cxx11_(pFVar7);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1c0,psVar8);
  }
  for (dep._4_4_ = 0; iVar5 = FileDescriptor::dependency_count(this->file_), dep._4_4_ < iVar5;
      dep._4_4_ = dep._4_4_ + 1) {
    pFVar7 = FileDescriptor::dependency(this->file_,dep._4_4_);
    psVar8 = FileDescriptor::name_abi_cxx11_(pFVar7);
    sVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1c0,psVar8);
    iter._M_current._7_1_ = sVar9 != 0;
    if (!(bool)iter._M_current._7_1_) {
      ImportWriter::AddFile
                ((ImportWriter *)((long)&header_extension.field_2 + 8),pFVar7,(string *)local_188);
    }
  }
  local_1f8._M_current =
       (FileDescriptor **)
       std::
       vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
       ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&import_writer.other_imports_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    iStack_200 = std::
                 vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)&import_writer.other_imports_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=(&local_1f8,&stack0xfffffffffffffe00);
    if (!bVar2) break;
    ppFVar12 = __gnu_cxx::
               __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
               ::operator*(&local_1f8);
    bVar2 = anon_unknown_0::IsDirectDependency(*ppFVar12,this->file_);
    if (!bVar2) {
      ppFVar12 = __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                 ::operator*(&local_1f8);
      ImportWriter::AddFile
                ((ImportWriter *)((long)&header_extension.field_2 + 8),*ppFVar12,(string *)local_188
                );
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
    ::operator++(&local_1f8);
  }
  ImportWriter::Print((ImportWriter *)((long)&header_extension.field_2 + 8),
                      (Printer *)
                      headers.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1c0);
  std::__cxx11::string::~string((string *)local_188);
  ImportWriter::~ImportWriter((ImportWriter *)((long)&header_extension.field_2 + 8));
  bVar2 = false;
  __end3 = std::
           vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
           ::begin(&this->message_generators_);
  generator = (unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
               *)std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ::end(&this->message_generators_);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                                *)&generator);
    if (!bVar3) {
LAB_00579352:
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range3_1);
      __end3_1 = std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ::begin(&this->message_generators_);
      generator_1 = (unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                     *)std::
                       vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                       ::end(&this->message_generators_);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                                 *)&generator_1), bVar3) {
        puVar14 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                  ::operator*(&__end3_1);
        pMVar15 = std::
                  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                  ::operator->(puVar14);
        MessageGenerator::DetermineObjectiveCClassDefinitions
                  (pMVar15,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range3_1);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
        ::operator++(&__end3_1);
      }
      __end3_2 = std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                 ::begin(&this->extension_generators_);
      generator_2 = (unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                     *)std::
                       vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                       ::end(&this->extension_generators_);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
                                 *)&generator_2), bVar3) {
        puVar10 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
                  ::operator*(&__end3_2);
        pEVar11 = std::
                  unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                  ::operator->(puVar10);
        ExtensionGenerator::DetermineObjectiveCClassDefinitions
                  (pEVar11,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range3_1);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
        ::operator++(&__end3_2);
      }
      io::Printer::Print<>
                ((Printer *)
                 headers.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "// @@protoc_insertion_point(imports)\n\n#pragma clang diagnostic push\n#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n"
                );
      if (bVar2) {
        io::Printer::Print<>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "#pragma clang diagnostic ignored \"-Wdirect-ivar-access\"\n");
      }
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3_1);
      if (!bVar2) {
        io::Printer::Print<>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "#pragma clang diagnostic ignored \"-Wdollar-in-identifier-extension\"\n");
      }
      io::Printer::Print<>
                ((Printer *)
                 headers.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3_1);
      if (!bVar2) {
        io::Printer::Print<>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "#pragma mark - Objective C Class declarations\n// Forward declarations of Objective C classes that we can use as\n// static values in struct initializers.\n// We don\'t use [Foo class] because it is not a static value.\n"
                  );
      }
      __end3_3 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3_1);
      i_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3_1);
      while (bVar2 = std::operator!=(&__end3_3,(_Self *)&i_2), bVar2) {
        args_1 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3_3);
        io::Printer::Print<char[6],std::__cxx11::string>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,"$value$\n",
                   (char (*) [6])0x7c8c1c,args_1);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_3);
      }
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3_1);
      if (!bVar2) {
        io::Printer::Print<>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
      }
      io::Printer::Print<char[16],std::__cxx11::string>
                ((Printer *)
                 headers.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "#pragma mark - $root_class_name$\n\n@implementation $root_class_name$\n\n",
                 (char (*) [16])"root_class_name",&this->root_class_name_);
      bVar2 = anon_unknown_0::FileContainsExtensions(this->file_);
      if ((bVar2) ||
         (bVar3 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::empty((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)&import_writer.other_imports_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar3)) {
        io::Printer::Print<>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "+ (GPBExtensionRegistry*)extensionRegistry {\n  // This is called by +initialize so there is no need to worry\n  // about thread safety and initialization of registry.\n  static GPBExtensionRegistry* registry = nil;\n  if (!registry) {\n    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n    registry = [[GPBExtensionRegistry alloc] init];\n"
                  );
        io::Printer::Indent((Printer *)
                            headers.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        io::Printer::Indent((Printer *)
                            headers.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          io::Printer::Print<>
                    ((Printer *)
                     headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "static GPBExtensionDescription descriptions[] = {\n");
          io::Printer::Indent((Printer *)
                              headers.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          __end5 = std::
                   vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                   ::begin(&this->extension_generators_);
          generator_3 = (unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                         *)std::
                           vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                           ::end(&this->extension_generators_);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
                                             *)&generator_3), bVar2) {
            puVar10 = __gnu_cxx::
                      __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
                      ::operator*(&__end5);
            pEVar11 = std::
                      unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                      ::operator->(puVar10);
            ExtensionGenerator::GenerateStaticVariablesInitialization
                      (pEVar11,(Printer *)
                               headers.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>_>
            ::operator++(&__end5);
          }
          __end5_1 = std::
                     vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                     ::begin(&this->message_generators_);
          generator_4 = (unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                         *)std::
                           vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                           ::end(&this->message_generators_);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end5_1,
                                    (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                                     *)&generator_4), bVar2) {
            iter_1._M_current =
                 (FileDescriptor **)
                 __gnu_cxx::
                 __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                 ::operator*(&__end5_1);
            pMVar15 = std::
                      unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                      ::operator->((unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                                    *)iter_1._M_current);
            MessageGenerator::GenerateStaticVariablesInitialization
                      (pMVar15,(Printer *)
                               headers.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
            ::operator++(&__end5_1);
          }
          io::Printer::Outdent
                    ((Printer *)
                     headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          io::Printer::Print<>
                    ((Printer *)
                     headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "};\nfor (size_t i = 0; i < sizeof(descriptions) / sizeof(descriptions[0]); ++i) {\n  GPBExtensionDescriptor *extension =\n      [[GPBExtensionDescriptor alloc] initWithExtensionDescription:&descriptions[i]\n                                                     usesClassRefs:YES];\n  [registry addExtension:extension];\n  [self globallyRegisterExtension:extension];\n  [extension release];\n}\n"
                    );
        }
        bVar2 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::empty((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         *)&import_writer.other_imports_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          io::Printer::Print<>
                    ((Printer *)
                     headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "// None of the imports (direct or indirect) defined extensions, so no need to add\n// them to this registry.\n"
                    );
        }
        else {
          io::Printer::Print<>
                    ((Printer *)
                     headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "// Merge in the imports (direct or indirect) that defined extensions.\n");
          local_308._M_current =
               (FileDescriptor **)
               std::
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::begin((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)&import_writer.other_imports_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          while( true ) {
            root_class_name.field_2._8_8_ =
                 std::
                 vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ::end((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)&import_writer.other_imports_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar2 = __gnu_cxx::operator!=
                              (&local_308,
                               (__normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                                *)((long)&root_class_name.field_2 + 8));
            if (!bVar2) break;
            ppFVar12 = __gnu_cxx::
                       __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                       ::operator*(&local_308);
            FileClassName_abi_cxx11_
                      ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (objectivec *)*ppFVar12,file);
            io::Printer::Print<char[11],std::__cxx11::string>
                      ((Printer *)
                       headers.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "[registry addExtensions:[$dependency$ extensionRegistry]];\n",
                       (char (*) [11])0x7cbc06,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::__cxx11::string::~string
                      ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            __gnu_cxx::
            __normal_iterator<const_google::protobuf::FileDescriptor_**,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
            ::operator++(&local_308);
          }
        }
        io::Printer::Outdent
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        io::Printer::Outdent
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        io::Printer::Print<>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,"  }\n  return registry;\n}\n"
                  );
      }
      else {
        iVar5 = FileDescriptor::dependency_count(this->file_);
        if (iVar5 < 1) {
          io::Printer::Print<>
                    ((Printer *)
                     headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "// No extensions in the file and no imports, so no need to generate\n// +extensionRegistry.\n"
                    );
        }
        else {
          io::Printer::Print<>
                    ((Printer *)
                     headers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "// No extensions in the file and none of the imports (direct or indirect)\n// defined extensions, so no need to generate +extensionRegistry.\n"
                    );
        }
      }
      io::Printer::Print<>
                ((Printer *)
                 headers.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n@end\n\n");
      bVar2 = std::
              vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
              ::empty(&this->message_generators_);
      if (!bVar2) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_360);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_380,"root_class_name",&local_381);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_360,&local_380);
        std::__cxx11::string::operator=((string *)pmVar13,(string *)&this->root_class_name_);
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
        psVar8 = FileDescriptor::package_abi_cxx11_(this->file_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3a8,"package",&local_3a9);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_360,&local_3a8);
        std::__cxx11::string::operator=((string *)pmVar13,(string *)psVar8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        FileClassPrefix_abi_cxx11_(&local_3d0,(objectivec *)this->file_,file_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3f0,"objc_prefix",&local_3f1);
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_360,&local_3f0);
        std::__cxx11::string::operator=((string *)pmVar13,(string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        std::__cxx11::string::~string((string *)&local_3d0);
        SVar6 = FileDescriptor::syntax(this->file_);
        if (SVar6 == SYNTAX_UNKNOWN) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_418,"syntax",&local_419);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_360,&local_418);
          std::__cxx11::string::operator=((string *)pmVar13,"GPBFileSyntaxUnknown");
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator((allocator<char> *)&local_419);
        }
        else if (SVar6 == SYNTAX_PROTO2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_440,"syntax",&local_441);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_360,&local_440);
          std::__cxx11::string::operator=((string *)pmVar13,"GPBFileSyntaxProto2");
          std::__cxx11::string::~string((string *)&local_440);
          std::allocator<char>::~allocator((allocator<char> *)&local_441);
        }
        else if (SVar6 == SYNTAX_PROTO3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_468,"syntax",&local_469);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_360,&local_468);
          std::__cxx11::string::operator=((string *)pmVar13,"GPBFileSyntaxProto3");
          std::__cxx11::string::~string((string *)&local_468);
          std::allocator<char>::~allocator((allocator<char> *)&local_469);
        }
        io::Printer::Print((Printer *)
                           headers.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_360,
                           "#pragma mark - $root_class_name$_FileDescriptor\n\nstatic GPBFileDescriptor *$root_class_name$_FileDescriptor(void) {\n  // This is called by +initialize so there is no need to worry\n  // about thread safety of the singleton.\n  static GPBFileDescriptor *descriptor = NULL;\n  if (!descriptor) {\n    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n"
                          );
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_490,"objc_prefix",(allocator *)((long)&__range3_4 + 7));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_360,&local_490);
        bVar4 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_490);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_4 + 7));
        if (((bVar4 ^ 0xff) & 1) == 0) {
          io::Printer::Print((Printer *)
                             headers.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_360,
                             "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n                                                     syntax:$syntax$];\n"
                            );
        }
        else {
          io::Printer::Print((Printer *)
                             headers.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_360,
                             "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n                                                 objcPrefix:@\"$objc_prefix$\"\n                                                     syntax:$syntax$];\n"
                            );
        }
        io::Printer::Print<>
                  ((Printer *)
                   headers.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "  }\n  return descriptor;\n}\n\n");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_360);
      }
      __end3_4 = std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
                 ::begin(&this->enum_generators_);
      generator_5 = (unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
                     *)std::
                       vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
                       ::end(&this->enum_generators_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_4,
                                (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>_>
                                 *)&generator_5), bVar2) {
        this_01 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>_>
                  ::operator*(&__end3_4);
        this_02 = std::
                  unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>
                  ::operator->(this_01);
        EnumGenerator::GenerateSource
                  (this_02,(Printer *)
                           headers.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>_>
        ::operator++(&__end3_4);
      }
      __end3_5 = std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                 ::begin(&this->message_generators_);
      generator_6 = (unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                     *)std::
                       vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                       ::end(&this->message_generators_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3_5,
                                (__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                                 *)&generator_6), bVar2) {
        puVar14 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                  ::operator*(&__end3_5);
        pMVar15 = std::
                  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                  ::operator->(puVar14);
        MessageGenerator::GenerateSource
                  (pMVar15,(Printer *)
                           headers.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
        ::operator++(&__end3_5);
      }
      io::Printer::Print<>
                ((Printer *)
                 headers.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 "\n#pragma clang diagnostic pop\n\n// @@protoc_insertion_point(global_scope)\n");
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range3_1);
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)&import_writer.other_imports_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_30);
      return;
    }
    fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)__gnu_cxx::
                 __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
                 ::operator*(&__end3);
    pMVar15 = std::
              unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
              ::operator->((unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                            *)fwd_decls._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar3 = MessageGenerator::IncludesOneOfDefinition(pMVar15);
    if (bVar3) {
      bVar2 = true;
      goto LAB_00579352;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

void FileGenerator::GenerateSource(io::Printer* printer) {
  // #import the runtime support.
  std::vector<std::string> headers;
  headers.push_back("GPBProtocolBuffers_RuntimeSupport.h");
  PrintFileRuntimePreamble(printer, headers);

  // Enums use atomic in the generated code, so add the system import as needed.
  if (FileContainsEnums(file_)) {
    printer->Print(
        "#import <stdatomic.h>\n"
        "\n");
  }

  std::vector<const FileDescriptor*> deps_with_extensions;
  CollectMinimalFileDepsContainingExtensions(file_, &deps_with_extensions);

  {
    ImportWriter import_writer(
        options_.generate_for_named_framework,
        options_.named_framework_to_proto_path_mappings_path,
        options_.runtime_import_prefix,
        is_bundled_proto_);
    const std::string header_extension(kHeaderExtension);

    // #import the header for this proto file.
    import_writer.AddFile(file_, header_extension);

    // #import the headers for anything that a plain dependency of this proto
    // file (that means they were just an include, not a "public" include).
    std::set<std::string> public_import_names;
    for (int i = 0; i < file_->public_dependency_count(); i++) {
      public_import_names.insert(file_->public_dependency(i)->name());
    }
    for (int i = 0; i < file_->dependency_count(); i++) {
      const FileDescriptor *dep = file_->dependency(i);
      bool public_import = (public_import_names.count(dep->name()) != 0);
      if (!public_import) {
        import_writer.AddFile(dep, header_extension);
      }
    }

    // If any indirect dependency provided extensions, it needs to be directly
    // imported so it can get merged into the root's extensions registry.
    // See the Note by CollectMinimalFileDepsContainingExtensions before
    // changing this.
    for (std::vector<const FileDescriptor*>::iterator iter =
             deps_with_extensions.begin();
         iter != deps_with_extensions.end(); ++iter) {
      if (!IsDirectDependency(*iter, file_)) {
        import_writer.AddFile(*iter, header_extension);
      }
    }

    import_writer.Print(printer);
  }

  bool includes_oneof = false;
  for (const auto& generator : message_generators_) {
    if (generator->IncludesOneOfDefinition()) {
      includes_oneof = true;
      break;
    }
  }

  std::set<std::string> fwd_decls;
  for (const auto& generator : message_generators_) {
    generator->DetermineObjectiveCClassDefinitions(&fwd_decls);
  }
  for (const auto& generator : extension_generators_) {
    generator->DetermineObjectiveCClassDefinitions(&fwd_decls);
  }

  // Note:
  //  deprecated-declarations suppression is only needed if some place in this
  //    proto file is something deprecated or if it references something from
  //    another file that is deprecated.
  //  dollar-in-identifier-extension is needed because we use references to
  //    objc class names that have $ in identifiers.
  printer->Print(
      "// @@protoc_insertion_point(imports)\n"
      "\n"
      "#pragma clang diagnostic push\n"
      "#pragma clang diagnostic ignored \"-Wdeprecated-declarations\"\n");
  if (includes_oneof) {
    // The generated code for oneof's uses direct ivar access, suppress the
    // warning in case developer turn that on in the context they compile the
    // generated code.
    printer->Print(
        "#pragma clang diagnostic ignored \"-Wdirect-ivar-access\"\n");
  }
  if (!fwd_decls.empty()) {
    printer->Print(
      "#pragma clang diagnostic ignored \"-Wdollar-in-identifier-extension\"\n");
  }
  printer->Print(
      "\n");
  if (!fwd_decls.empty()) {
    printer->Print(
        "#pragma mark - Objective C Class declarations\n"
        "// Forward declarations of Objective C classes that we can use as\n"
        "// static values in struct initializers.\n"
        "// We don't use [Foo class] because it is not a static value.\n");
  }
  for (const auto& i : fwd_decls) {
    printer->Print("$value$\n", "value", i);
  }
  if (!fwd_decls.empty()) {
    printer->Print("\n");
  }
  printer->Print(
      "#pragma mark - $root_class_name$\n"
      "\n"
      "@implementation $root_class_name$\n\n",
      "root_class_name", root_class_name_);

  const bool file_contains_extensions = FileContainsExtensions(file_);

  // If there were any extensions or this file has any dependencies, output
  // a registry to override to create the file specific registry.
  if (file_contains_extensions || !deps_with_extensions.empty()) {
    printer->Print(
        "+ (GPBExtensionRegistry*)extensionRegistry {\n"
        "  // This is called by +initialize so there is no need to worry\n"
        "  // about thread safety and initialization of registry.\n"
        "  static GPBExtensionRegistry* registry = nil;\n"
        "  if (!registry) {\n"
        "    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n"
        "    registry = [[GPBExtensionRegistry alloc] init];\n");

    printer->Indent();
    printer->Indent();

    if (file_contains_extensions) {
      printer->Print(
          "static GPBExtensionDescription descriptions[] = {\n");
      printer->Indent();
      for (const auto& generator : extension_generators_) {
        generator->GenerateStaticVariablesInitialization(printer);
      }
      for (const auto& generator : message_generators_) {
        generator->GenerateStaticVariablesInitialization(printer);
      }
      printer->Outdent();
      printer->Print(
          "};\n"
          "for (size_t i = 0; i < sizeof(descriptions) / sizeof(descriptions[0]); ++i) {\n"
          "  GPBExtensionDescriptor *extension =\n"
          "      [[GPBExtensionDescriptor alloc] initWithExtensionDescription:&descriptions[i]\n"
          "                                                     usesClassRefs:YES];\n"
          "  [registry addExtension:extension];\n"
          "  [self globallyRegisterExtension:extension];\n"
          "  [extension release];\n"
          "}\n");
    }

    if (deps_with_extensions.empty()) {
      printer->Print(
          "// None of the imports (direct or indirect) defined extensions, so no need to add\n"
          "// them to this registry.\n");
    } else {
      printer->Print(
          "// Merge in the imports (direct or indirect) that defined extensions.\n");
      for (std::vector<const FileDescriptor*>::iterator iter =
               deps_with_extensions.begin();
           iter != deps_with_extensions.end(); ++iter) {
        const std::string root_class_name(FileClassName((*iter)));
        printer->Print(
            "[registry addExtensions:[$dependency$ extensionRegistry]];\n",
            "dependency", root_class_name);
      }
    }

    printer->Outdent();
    printer->Outdent();

    printer->Print(
        "  }\n"
        "  return registry;\n"
        "}\n");
  } else {
    if (file_->dependency_count() > 0) {
      printer->Print(
          "// No extensions in the file and none of the imports (direct or indirect)\n"
          "// defined extensions, so no need to generate +extensionRegistry.\n");
    } else {
      printer->Print(
          "// No extensions in the file and no imports, so no need to generate\n"
          "// +extensionRegistry.\n");
    }
  }

  printer->Print("\n@end\n\n");

  // File descriptor only needed if there are messages to use it.
  if (!message_generators_.empty()) {
    std::map<std::string, std::string> vars;
    vars["root_class_name"] = root_class_name_;
    vars["package"] = file_->package();
    vars["objc_prefix"] = FileClassPrefix(file_);
    switch (file_->syntax()) {
      case FileDescriptor::SYNTAX_UNKNOWN:
        vars["syntax"] = "GPBFileSyntaxUnknown";
        break;
      case FileDescriptor::SYNTAX_PROTO2:
        vars["syntax"] = "GPBFileSyntaxProto2";
        break;
      case FileDescriptor::SYNTAX_PROTO3:
        vars["syntax"] = "GPBFileSyntaxProto3";
        break;
    }
    printer->Print(vars,
        "#pragma mark - $root_class_name$_FileDescriptor\n"
        "\n"
        "static GPBFileDescriptor *$root_class_name$_FileDescriptor(void) {\n"
        "  // This is called by +initialize so there is no need to worry\n"
        "  // about thread safety of the singleton.\n"
        "  static GPBFileDescriptor *descriptor = NULL;\n"
        "  if (!descriptor) {\n"
        "    GPB_DEBUG_CHECK_RUNTIME_VERSIONS();\n");
    if (!vars["objc_prefix"].empty()) {
      printer->Print(
          vars,
          "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n"
          "                                                 objcPrefix:@\"$objc_prefix$\"\n"
          "                                                     syntax:$syntax$];\n");
    } else {
      printer->Print(
          vars,
          "    descriptor = [[GPBFileDescriptor alloc] initWithPackage:@\"$package$\"\n"
          "                                                     syntax:$syntax$];\n");
    }
    printer->Print(
        "  }\n"
        "  return descriptor;\n"
        "}\n"
        "\n");
  }

  for (const auto& generator : enum_generators_) {
    generator->GenerateSource(printer);
  }
  for (const auto& generator : message_generators_) {
    generator->GenerateSource(printer);
  }

  printer->Print(
    "\n"
    "#pragma clang diagnostic pop\n"
    "\n"
    "// @@protoc_insertion_point(global_scope)\n");
}